

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo3.cpp
# Opt level: O2

int64_t primesum::pi_lmo3(int64_t x)

{
  long x_00;
  long lVar1;
  int iVar2;
  int iVar3;
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  int64_t b;
  long lVar4;
  long lVar5;
  size_type __n;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  long lVar9;
  int128_t *piVar10;
  long lVar11;
  ulong uVar12;
  int128_t *__return_storage_ptr__;
  int64_t iVar13;
  int64_t m;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  vector<int,_std::allocator<int>_> primes;
  int256_t phi;
  ulong local_160;
  vector<long,_std::allocator<long>_> next;
  vector<long,_std::allocator<long>_> phi_1;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> mu;
  int256_t s1;
  value_type_conflict7 local_60;
  int256_t p2;
  
  if (x < 2) {
    iVar13 = 0;
  }
  else {
    x_01._8_8_ = in_stack_fffffffffffffe50;
    x_01._0_8_ = in_stack_fffffffffffffe48;
    dVar19 = get_alpha_lmo((primesum *)x,(int128_t)x_01);
    lVar4 = iroot<3,long>(x);
    __return_storage_ptr__ = (int128_t *)(long)((double)lVar4 * dVar19);
    if ((long)__return_storage_ptr__ < 0xd) {
      lVar4 = (long)*(int *)(PhiTiny::pi + (long)__return_storage_ptr__ * 4);
    }
    else {
      lVar4 = 6;
    }
    x_02._8_8_ = lVar4;
    x_02._0_8_ = in_stack_fffffffffffffe48;
    P2(&p2,(primesum *)x,(int128_t)x_02,0,(int)__return_storage_ptr__);
    generate_moebius(&mu,(int64_t)__return_storage_ptr__);
    generate_lpf(&lpf,(int64_t)__return_storage_ptr__);
    generate_primes(&primes,(int64_t)__return_storage_ptr__);
    x_03._8_8_ = lVar4;
    x_03._0_8_ = in_stack_fffffffffffffe48;
    S1(&s1,(primesum *)x,(int128_t)x_03,0,(int64_t)__return_storage_ptr__,(int)lVar4);
    x_00 = x / (long)__return_storage_ptr__ + 1;
    lVar5 = isqrt<long>(x_00);
    __n = next_power_of_2<long>(lVar5);
    lVar6 = pi_bsearch<int,long>(&primes,(long)__return_storage_ptr__);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&phi,__n,(allocator_type *)&next);
    std::vector<long,std::allocator<long>>::
    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<long,std::allocator<long>> *)&next,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,(allocator_type *)&phi_1);
    local_60 = 0;
    std::vector<long,_std::allocator<long>_>::vector
              (&phi_1,(long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2,&local_60,
               (allocator_type *)&stack0xfffffffffffffe4f);
    local_160 = 0;
    lVar5 = 0;
    if (0 < lVar4) {
      lVar5 = lVar4;
    }
    lVar15 = -1;
    lVar16 = 1;
    while (puVar7 = (undefined1 *)phi.low, lVar16 <= x / (long)__return_storage_ptr__) {
      for (; puVar7 != phi.low._8_8_; puVar7 = puVar7 + 1) {
        *puVar7 = 1;
      }
      lVar1 = lVar16 + __n;
      lVar17 = lVar1;
      if (x_00 < lVar1) {
        lVar17 = x_00;
      }
      for (lVar8 = 1; lVar8 != lVar5 + 1; lVar8 = lVar8 + 1) {
        iVar2 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar8];
        for (lVar11 = next.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8]; lVar11 < lVar17;
            lVar11 = lVar11 + iVar2) {
          ((undefined1 *)phi.low)[lVar11 + lVar15] = 0;
        }
        next.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar8] = lVar11;
      }
      lVar8 = lVar4;
      while (lVar8 = lVar8 + 1, lVar8 < lVar6) {
        iVar2 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar8];
        lVar14 = (long)iVar2;
        lVar9 = x / (lVar17 * lVar14);
        lVar11 = (long)__return_storage_ptr__ / lVar14;
        if ((long)__return_storage_ptr__ / lVar14 < lVar9) {
          lVar11 = lVar9;
        }
        piVar10 = (int128_t *)(x / (lVar16 * lVar14));
        if ((long)__return_storage_ptr__ <= (long)piVar10) {
          piVar10 = __return_storage_ptr__;
        }
        if ((long)piVar10 <= lVar14) break;
        lVar9 = 0;
        for (; lVar11 < (long)piVar10; piVar10 = (int128_t *)((long)piVar10 + -1)) {
          iVar3 = mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[(long)piVar10];
          if (((long)iVar3 != 0) &&
             (iVar2 < lpf.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)piVar10])) {
            for (; lVar9 <= x / ((long)piVar10 * lVar14) - lVar16; lVar9 = lVar9 + 1) {
              phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar8] =
                   phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8] +
                   (long)(char)((undefined1 *)phi.low)[lVar9] * (lVar16 + lVar9);
            }
            local_160 = local_160 -
                        (long)piVar10 * lVar14 * (long)iVar3 *
                        phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8];
          }
        }
        for (; lVar9 < lVar17 - lVar16; lVar9 = lVar9 + 1) {
          phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar8] =
               phi_1.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar8] + (long)(char)((undefined1 *)phi.low)[lVar9] * (lVar16 + lVar9);
        }
        for (lVar11 = next.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8]; lVar11 < lVar17;
            lVar11 = lVar11 + lVar14 * 2) {
          ((undefined1 *)phi.low)[lVar11 + lVar15] = 0;
        }
        next.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar8] = lVar11;
      }
      lVar15 = lVar15 - __n;
      lVar16 = lVar1;
    }
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&phi_1.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&next.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&phi);
    uVar12 = (long)local_160 >> 0x3f;
    phi.high._0_8_ = (ulong)s1.high + uVar12;
    phi.high._8_8_ = s1.high._8_8_ + uVar12 + (ulong)CARRY8((ulong)s1.high,uVar12);
    phi.low._0_8_ = (undefined1 *)(local_160 + (ulong)s1.low);
    phi.low._8_8_ = (undefined1 *)(uVar12 + s1.low._8_8_ + (ulong)CARRY8(local_160,(ulong)s1.low));
    if (CARRY8(uVar12,s1.low._8_8_) ||
        CARRY8(uVar12 + s1.low._8_8_,(ulong)CARRY8(local_160,(ulong)s1.low))) {
      bVar18 = 0xfffffffffffffffe < (ulong)phi.high;
      phi.high._0_8_ = (ulong)phi.high + 1;
      phi.high._8_8_ = phi.high._8_8_ + (ulong)bVar18;
    }
    prime_sum_tiny(__return_storage_ptr__,(int64_t)(undefined1 *)phi.low);
    x_04._8_8_ = lVar4;
    x_04._0_8_ = in_stack_fffffffffffffe48;
    int256_t::operator+((int256_t *)&phi_1,&phi,(__int128)x_04);
    int256_t::operator-((int256_t *)&next,(int256_t *)&phi_1,1);
    iVar13 = (long)next.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)p2.low;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&primes.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&lpf.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&mu.super__Vector_base<int,_std::allocator<int>_>);
  }
  return iVar13;
}

Assistant:

int64_t pi_lmo3(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}